

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O0

void collect_mv_stats_b(MV_STATS *mv_stats,AV1_COMP *cpi,int mi_row,int mi_col)

{
  PREDICTION_MODE PVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  MV_STATS *mv_stats_00;
  MV *ref_mv_00;
  AV1_COMP *cpi_00;
  long lVar9;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int vert_diff_1;
  int horz_diff_1;
  int offset_1;
  int col_1;
  int row_1;
  uint8_t *source_buf_1;
  int vert_diff;
  int horz_diff;
  int offset;
  int col;
  int row;
  uint16_t *source_buf;
  int bd;
  int buf_is_hbd;
  int px_col;
  int px_row;
  int y_stride;
  int num_cols;
  int num_rows;
  BLOCK_SIZE bsize;
  MV cur_mv_1;
  MV ref_mv_1;
  int ref_idx_1;
  MV cur_mv;
  MV ref_mv;
  int ref_idx;
  int is_compound;
  PREDICTION_MODE mode;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame;
  MB_MODE_INFO *mbmi;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int local_b0;
  int local_ac;
  int local_90;
  int local_8c;
  int local_44;
  MB_MODE_INFO *mbmi_00;
  
  mv_stats_00 = (MV_STATS *)(in_RSI + 0x3bf80);
  ref_mv_00 = (MV *)(in_RSI + 0x3c188);
  if ((in_EDX < *(int *)(in_RSI + 0x3c194)) && (in_ECX < *(int *)(in_RSI + 0x3c198))) {
    mbmi_00 = *(MB_MODE_INFO **)
               (*(long *)(in_RSI + 0x3c1b8) +
               (long)(in_EDX * *(int *)(in_RSI + 0x3c1c4) + in_ECX) * 8);
    lVar9 = *(long *)(in_RSI + 0x3bf50);
    iVar6 = get_mi_ext_idx(in_EDX,in_ECX,*(BLOCK_SIZE *)(in_RSI + 0x3c1b0),
                           *(int *)(in_RSI + 0x3bf5c));
    cpi_00 = (AV1_COMP *)(lVar9 + (long)iVar6 * 0x54);
    iVar6 = is_inter_block((MB_MODE_INFO *)
                           CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    if (iVar6 == 0) {
      *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
    }
    else {
      *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
      PVar1 = mbmi_00->mode;
      iVar6 = has_second_ref(mbmi_00);
      if ((PVar1 == '\x10') || (PVar1 == '\x18')) {
        for (local_44 = 0; local_44 < iVar6 + 1; local_44 = local_44 + 1) {
          get_ref_mv_for_mv_stats
                    ((MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (MB_MODE_INFO_EXT_FRAME *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (int)((ulong)lVar9 >> 0x20));
          keep_one_mv_stat(mv_stats_00,ref_mv_00,(MV *)mbmi_00,cpi_00);
        }
      }
      else if ((((PVar1 == '\x13') || (PVar1 == '\x15')) || (PVar1 == '\x14')) || (PVar1 == '\x16'))
      {
        *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
        get_ref_mv_for_mv_stats
                  ((MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (MB_MODE_INFO_EXT_FRAME *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (int)((ulong)lVar9 >> 0x20));
        keep_one_mv_stat(mv_stats_00,ref_mv_00,(MV *)mbmi_00,cpi_00);
      }
      else {
        *(int *)(in_RDI + 0x14) = iVar6 + 1 + *(int *)(in_RDI + 0x14);
      }
      bVar2 = block_size_high[mbmi_00->bsize];
      bVar3 = block_size_wide[mbmi_00->bsize];
      iVar6 = *(int *)(*(long *)(in_RSI + 0x427a8) + 0x20);
      uVar4 = *(undefined4 *)(*(long *)&mv_stats_00[0x145].inter_count + 0x48);
      if ((*(uint *)(*(long *)(in_RSI + 0x427a8) + 0xc0) & 8) == 0) {
        lVar9 = *(long *)(*(long *)(in_RSI + 0x427a8) + 0x28) + (long)(in_EDX * 4 * iVar6) +
                (long)(in_ECX << 2);
        for (local_ac = 0; local_ac < (int)(bVar2 - 1); local_ac = local_ac + 1) {
          for (local_b0 = 0; local_b0 < (int)(bVar3 - 1); local_b0 = local_b0 + 1) {
            iVar7 = local_ac * iVar6 + local_b0;
            iVar8 = (uint)*(byte *)(lVar9 + (iVar7 + 1)) - (uint)*(byte *)(lVar9 + iVar7);
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            iVar7 = (uint)*(byte *)(lVar9 + (iVar7 + iVar6)) - (uint)*(byte *)(lVar9 + iVar7);
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            *(int *)(in_RDI + 0x3c) = iVar8 + *(int *)(in_RDI + 0x3c);
            *(int *)(in_RDI + 0x40) = iVar7 + *(int *)(in_RDI + 0x40);
            *(int *)(in_RDI + 0x44) = iVar8 * iVar7 + *(int *)(in_RDI + 0x44);
          }
        }
      }
      else {
        lVar9 = *(long *)(*(long *)(in_RSI + 0x427a8) + 0x28) * 2 + (long)(in_EDX * 4 * iVar6) * 2 +
                (long)(in_ECX << 2) * 2;
        for (local_8c = 0; local_8c < (int)(bVar2 - 1); local_8c = local_8c + 1) {
          for (local_90 = 0; local_90 < (int)(bVar3 - 1); local_90 = local_90 + 1) {
            iVar7 = local_8c * iVar6 + local_90;
            iVar8 = (uint)*(ushort *)(lVar9 + (long)(iVar7 + 1) * 2) -
                    (uint)*(ushort *)(lVar9 + (long)iVar7 * 2);
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            cVar5 = (char)uVar4;
            iVar8 = iVar8 >> (cVar5 - 8U & 0x1f);
            iVar7 = (uint)*(ushort *)(lVar9 + (long)(iVar7 + iVar6) * 2) -
                    (uint)*(ushort *)(lVar9 + (long)iVar7 * 2);
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            iVar7 = iVar7 >> (cVar5 - 8U & 0x1f);
            *(int *)(in_RDI + 0x3c) = iVar8 + *(int *)(in_RDI + 0x3c);
            *(int *)(in_RDI + 0x40) = iVar7 + *(int *)(in_RDI + 0x40);
            *(int *)(in_RDI + 0x44) = iVar8 * iVar7 + *(int *)(in_RDI + 0x44);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void collect_mv_stats_b(MV_STATS *mv_stats, const AV1_COMP *cpi,
                                      int mi_row, int mi_col) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) {
    return;
  }

  const MB_MODE_INFO *mbmi =
      mi_params->mi_grid_base[mi_row * mi_params->mi_stride + mi_col];
  const MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame =
      cpi->mbmi_ext_info.frame_base +
      get_mi_ext_idx(mi_row, mi_col, cm->mi_params.mi_alloc_bsize,
                     cpi->mbmi_ext_info.stride);

  if (!is_inter_block(mbmi)) {
    mv_stats->intra_count++;
    return;
  }
  mv_stats->inter_count++;

  const PREDICTION_MODE mode = mbmi->mode;
  const int is_compound = has_second_ref(mbmi);

  if (mode == NEWMV || mode == NEW_NEWMV) {
    // All mvs are new
    for (int ref_idx = 0; ref_idx < 1 + is_compound; ++ref_idx) {
      const MV ref_mv =
          get_ref_mv_for_mv_stats(mbmi, mbmi_ext_frame, ref_idx).as_mv;
      const MV cur_mv = mbmi->mv[ref_idx].as_mv;
      keep_one_mv_stat(mv_stats, &ref_mv, &cur_mv, cpi);
    }
  } else if (mode == NEAREST_NEWMV || mode == NEAR_NEWMV ||
             mode == NEW_NEARESTMV || mode == NEW_NEARMV) {
    // has exactly one new_mv
    mv_stats->default_mvs += 1;

    const int ref_idx = (mode == NEAREST_NEWMV || mode == NEAR_NEWMV);
    const MV ref_mv =
        get_ref_mv_for_mv_stats(mbmi, mbmi_ext_frame, ref_idx).as_mv;
    const MV cur_mv = mbmi->mv[ref_idx].as_mv;

    keep_one_mv_stat(mv_stats, &ref_mv, &cur_mv, cpi);
  } else {
    // No new_mv
    mv_stats->default_mvs += 1 + is_compound;
  }

  // Add texture information
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int num_rows = block_size_high[bsize];
  const int num_cols = block_size_wide[bsize];
  const int y_stride = cpi->source->y_stride;
  const int px_row = 4 * mi_row, px_col = 4 * mi_col;
  const int buf_is_hbd = cpi->source->flags & YV12_FLAG_HIGHBITDEPTH;
  const int bd = cm->seq_params->bit_depth;
  if (buf_is_hbd) {
    uint16_t *source_buf =
        CONVERT_TO_SHORTPTR(cpi->source->y_buffer) + px_row * y_stride + px_col;
    for (int row = 0; row < num_rows - 1; row++) {
      for (int col = 0; col < num_cols - 1; col++) {
        const int offset = row * y_stride + col;
        const int horz_diff =
            abs(source_buf[offset + 1] - source_buf[offset]) >> (bd - 8);
        const int vert_diff =
            abs(source_buf[offset + y_stride] - source_buf[offset]) >> (bd - 8);
        mv_stats->horz_text += horz_diff;
        mv_stats->vert_text += vert_diff;
        mv_stats->diag_text += horz_diff * vert_diff;
      }
    }
  } else {
    uint8_t *source_buf = cpi->source->y_buffer + px_row * y_stride + px_col;
    for (int row = 0; row < num_rows - 1; row++) {
      for (int col = 0; col < num_cols - 1; col++) {
        const int offset = row * y_stride + col;
        const int horz_diff = abs(source_buf[offset + 1] - source_buf[offset]);
        const int vert_diff =
            abs(source_buf[offset + y_stride] - source_buf[offset]);
        mv_stats->horz_text += horz_diff;
        mv_stats->vert_text += vert_diff;
        mv_stats->diag_text += horz_diff * vert_diff;
      }
    }
  }
}